

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherInotify.cpp
# Opt level: O0

WatchID __thiscall
efsw::FileWatcherInotify::addWatch
          (FileWatcherInotify *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  bool bVar1;
  Error EVar2;
  int iVar3;
  bool syntheticEvents;
  Lock initLock;
  string local_58 [32];
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *local_38;
  vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options_local;
  FileWatchListener *pFStack_28;
  bool recursive_local;
  FileWatchListener *watcher_local;
  string *directory_local;
  FileWatcherInotify *this_local;
  
  local_38 = options;
  options_local._7_1_ = recursive;
  pFStack_28 = watcher;
  watcher_local = (FileWatchListener *)directory;
  directory_local = (string *)this;
  bVar1 = Atomic::operator_cast_to_bool((Atomic *)&(this->super_FileWatcherImpl).mInitOK);
  if (bVar1) {
    Lock::Lock((Lock *)&stack0xffffffffffffff90,&this->mInitLock);
    iVar3 = FileWatcherImpl::getOptionValue
                      (&this->super_FileWatcherImpl,local_38,LinuxProduceSyntheticEvents,0);
    this_local = (FileWatcherInotify *)
                 addWatch(this,(string *)watcher_local,pFStack_28,(bool)(options_local._7_1_ & 1),
                          iVar3 != 0,(WatcherInotify *)0x0,false);
    Lock::~Lock((Lock *)&stack0xffffffffffffff90);
  }
  else {
    std::__cxx11::string::string(local_58,(string *)watcher_local);
    EVar2 = Errors::Log::createLastError(Unspecified,(string *)local_58);
    this_local = (FileWatcherInotify *)(long)EVar2;
    std::__cxx11::string::~string(local_58);
  }
  return (WatchID)this_local;
}

Assistant:

WatchID FileWatcherInotify::addWatch( const std::string& directory, FileWatchListener* watcher,
									  bool recursive, const std::vector<WatcherOption>& options ) {
	if ( !mInitOK )
		return Errors::Log::createLastError( Errors::Unspecified, directory );
	Lock initLock( mInitLock );
	bool syntheticEvents = getOptionValue( options, Options::LinuxProduceSyntheticEvents, 0 ) != 0;
	return addWatch( directory, watcher, recursive, syntheticEvents, NULL );
}